

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vertex.cpp
# Opt level: O1

void __thiscall
Vertex::Vertex(Vertex *this,string *sequence,int pos,vector<int,_std::allocator<int>_> *qual,
              int number,int q,int tresh)

{
  (this->qual_list).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->qual_list).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  this->quality = 0;
  this->treshhold = 0;
  this->seq_number = 0;
  this->position = 0;
  (this->qual_list).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->seq)._M_dataplus._M_p = (pointer)&(this->seq).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->seq,"");
  (this->seq_del)._M_dataplus._M_p = (pointer)&(this->seq_del).field_2;
  (this->seq_del)._M_string_length = 0;
  (this->seq_del).field_2._M_local_buf[0] = '\0';
  this->compared_as_mutated = false;
  std::__cxx11::string::_M_assign((string *)&this->seq);
  std::__cxx11::string::_M_assign((string *)&this->seq_del);
  this->position = pos;
  std::vector<int,_std::allocator<int>_>::operator=(&this->qual_list,qual);
  this->seq_number = number;
  this->quality = q;
  this->treshhold = tresh;
  mutateVertex(this);
  return;
}

Assistant:

Vertex::Vertex(string sequence, int pos, vector<int> qual, int number, int q, int tresh){
    this->seq = sequence;
    this->seq_del = sequence;
    this->position = pos;
    this->qual_list = qual;
    this->seq_number = number;
    this->quality = q;
    this->treshhold = tresh;
    this->mutateVertex();

}